

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::Functional::anon_unknown_0::ScissorPrimitiveCase::render
          (ScissorPrimitiveCase *this,GLuint program,IVec4 *param_2)

{
  float fVar1;
  float fVar2;
  DataType DVar3;
  undefined *puVar4;
  glUniform4fvFunc p_Var5;
  int iVar6;
  int iVar7;
  GLint GVar8;
  undefined4 extraout_var;
  int iVar9;
  long lVar10;
  int iVar11;
  DataType DVar12;
  ulong uVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  float local_d4;
  int local_cc;
  float local_bc;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  Random rng;
  vector<float,_std::allocator<float>_> positions;
  GLfloat local_48 [6];
  Functions *gl;
  
  iVar6 = (*((this->super_ScissorCase).m_renderCtx)->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar6);
  local_48[0] = 1.0;
  local_48[1] = 1.0;
  local_48[2] = 1.0;
  local_48[3] = 1.0;
  fVar16 = (this->m_renderArea).m_data[0];
  fVar1 = (this->m_renderArea).m_data[2];
  fVar2 = (this->m_renderArea).m_data[3];
  uVar13 = (ulong)this->m_primitiveType;
  puVar4 = (&PTR_pointPosition_01e76260)[uVar13];
  DVar3 = deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes[uVar13];
  iVar6 = *(int *)(&DAT_01903690 + uVar13 * 4);
  fVar15 = (float)this->m_primitiveCount + (float)this->m_primitiveCount;
  if (fVar15 < 0.0) {
    fVar15 = sqrtf(fVar15);
  }
  else {
    fVar15 = SQRT(fVar15);
  }
  std::vector<float,_std::allocator<float>_>::vector
            (&positions,(long)(int)(this->m_primitiveCount * DVar3 * 4),(allocator_type *)&indices);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&indices,(long)(this->m_primitiveCount * iVar6),(allocator_type *)&rng);
  deRandom_init(&rng.m_rnd,0x4d2);
  fVar16 = fVar16 + fVar16 + -1.0;
  iVar7 = 0;
  DVar12 = TYPE_INVALID;
  if (0 < (int)DVar3) {
    DVar12 = DVar3;
  }
  iVar11 = 0;
  if (0 < iVar6) {
    iVar11 = iVar6;
  }
  local_cc = 3;
  for (iVar14 = 0; iVar14 < this->m_primitiveCount; iVar14 = iVar14 + 1) {
    local_d4 = 0.0;
    if (this->m_primitiveCount < 2) {
      local_bc = 0.0;
    }
    else {
      local_bc = deRandom_getFloat(&rng.m_rnd);
      if (1 < this->m_primitiveCount) {
        local_d4 = deRandom_getFloat(&rng.m_rnd);
      }
    }
    lVar10 = 0;
    iVar9 = local_cc;
    for (uVar13 = 0; DVar12 * 2 != uVar13; uVar13 = uVar13 + 2) {
      positions.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar9 + -3] =
           (*(float *)(puVar4 + (lVar10 >> 0x1e)) * (1.44 / fVar15) + local_bc) * (fVar1 + fVar1) +
           fVar16;
      positions.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar9 + -2] =
           (*(float *)(puVar4 + (long)((int)uVar13 + 1) * 4) * (1.44 / fVar15) + local_d4) *
           (fVar2 + fVar2) + fVar16;
      positions.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar9 + -1] = 0.2;
      positions.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar9] = 1.0;
      lVar10 = lVar10 + 0x200000000;
      iVar9 = iVar9 + 4;
    }
    iVar9 = iVar7;
    for (uVar13 = 0; (uint)(iVar11 * 2) != uVar13; uVar13 = uVar13 + 2) {
      indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[iVar9] =
           *(short *)((long)&DAT_019037c0 + uVar13) + (short)iVar14 * (short)DVar3;
      iVar9 = iVar9 + 1;
    }
    local_cc = local_cc + DVar3 * 4;
    iVar7 = iVar7 + iVar6;
  }
  p_Var5 = gl->uniform4fv;
  GVar8 = (*gl->getUniformLocation)(program,"u_color");
  (*p_Var5)(GVar8,1,local_48);
  if ((ulong)this->m_primitiveType < 3) {
    drawPrimitives(gl,program,*(deUint32 *)(&DAT_01903844 + (ulong)this->m_primitiveType * 4),
                   &positions,&indices);
  }
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&positions.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void ScissorPrimitiveCase::render (GLuint program, const IVec4&) const
{
	const glw::Functions&		gl				= m_renderCtx.getFunctions();
	const Vec4					white			(1.0f, 1.0f, 1.0f, 1.0);
	const Vec4					primitiveArea	(m_renderArea.x()*2.0f-1.0f,
												 m_renderArea.x()*2.0f-1.0f,
												 m_renderArea.z()*2.0f,
												 m_renderArea.w()*2.0f);

	static const float quadPositions[] =
	{
		 0.0f,  1.0f,
		 0.0f,  0.0f,
		 1.0f,  1.0f,
		 1.0f,  0.0f
	};
	static const float triPositions[] =
	{
		 0.0f,  0.0f,
		 1.0f,  0.0f,
		 0.5f,  1.0f,
	};
	static const float linePositions[] =
	{
		 0.0f,  0.0f,
		 1.0f,  1.0f
	};
	static const float pointPosition[] =
	{
		 0.5f,  0.5f
	};

	const float*		positionSet[]	= { pointPosition, linePositions, triPositions, quadPositions };
	const int			vertexCountSet[]= { 1, 2, 3, 4 };
	const int			indexCountSet[]	= { 1, 2, 3, 6 };

	const deUint16		baseIndices[]	= { 0, 1, 2, 2, 1, 3 };
	const float*		basePositions	= positionSet[m_primitiveType];
	const int			vertexCount		= vertexCountSet[m_primitiveType];
	const int			indexCount		= indexCountSet[m_primitiveType];

	const float			scale			= 1.44f/deFloatSqrt(float(m_primitiveCount)*2.0f); // Magic value to roughly fill the render area with primitives at a readable density
	vector<float>		positions		(4*vertexCount*m_primitiveCount);
	vector<deUint16>	indices			(indexCount*m_primitiveCount);
	de::Random			rng				(1234);

	for (int primNdx = 0; primNdx < m_primitiveCount; primNdx++)
	{
		const float dx = m_primitiveCount>1 ? rng.getFloat() : 0.0f;
		const float dy = m_primitiveCount>1 ? rng.getFloat() : 0.0f;

		for (int vertNdx = 0; vertNdx < vertexCount; vertNdx++)
		{
			const int ndx = primNdx*4*vertexCount + vertNdx*4;
			positions[ndx+0] = (basePositions[vertNdx*2 + 0]*scale + dx)*primitiveArea.z() + primitiveArea.x();
			positions[ndx+1] = (basePositions[vertNdx*2 + 1]*scale + dy)*primitiveArea.w() + primitiveArea.y();
			positions[ndx+2] = 0.2f;
			positions[ndx+3] = 1.0f;
		}

		for (int ndx = 0; ndx < indexCount; ndx++)
			indices[primNdx*indexCount + ndx] = (deUint16)(baseIndices[ndx] + primNdx*vertexCount);
	}

	gl.uniform4fv(gl.getUniformLocation(program, "u_color"), 1, white.m_data);

	switch (m_primitiveType)
	{
		case TRIANGLE:	drawPrimitives(gl, program, GL_TRIANGLES,	positions, indices);	break;
		case LINE:		drawPrimitives(gl, program, GL_LINES,		positions, indices);	break;
		case POINT:		drawPrimitives(gl, program, GL_POINTS,		positions, indices);	break;
		default:		DE_ASSERT(false);													break;
	}
}